

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O0

ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
 testing::
 ValuesIn<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>,66ul>
           (TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
            (*array) [66])

{
  element_type *in_RDI;
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
  PVar1;
  TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
  *in_stack_00000010;
  TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
  *in_stack_00000018;
  
  PVar1 = ValuesIn<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,int,int,int_const*,int_const*,unsigned_int*)>const*>
                    (in_stack_00000018,in_stack_00000010);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_int_*,_const_int_*,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}